

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O3

void __thiscall
fill<32U,_11U,_buffer_layout_dfs>::operator()
          (fill<32U,_11U,_buffer_layout_dfs> *this,array<Stream,_32UL> *streams,uchar **buffer,
          array<unsigned_long,_32UL> *buffer_count)

{
  uchar *__s1;
  unsigned_long *puVar1;
  int iVar2;
  unsigned_long *puVar3;
  unsigned_long uVar4;
  uchar **from0;
  unsigned_long uVar5;
  uchar **__dest;
  long lVar6;
  size_t __n;
  uchar *__s2;
  size_t sVar7;
  fill<32U,_22U,_buffer_layout_dfs> local_64;
  fill<32U,_23U,_buffer_layout_dfs> local_63;
  fill<32U,_23U,_buffer_layout_dfs> local_62;
  fill<32U,_22U,_buffer_layout_dfs> local_61;
  uchar **local_60;
  array<Stream,_32UL> *local_58;
  unsigned_long *local_50;
  uchar **local_48;
  unsigned_long *local_40;
  long local_38;
  
  puVar3 = buffer_count->_M_elems + 0x16;
  local_50 = buffer_count->_M_elems + 0x17;
  local_48 = buffer + 0x33e;
  local_60 = buffer + 0x288;
  sVar7 = 0;
  lVar6 = 0;
  local_58 = streams;
  local_40 = puVar3;
  do {
    uVar4 = *puVar3;
    if (uVar4 == 0) {
      fill<32U,_22U,_buffer_layout_dfs>::operator()(&local_61,local_58,buffer,buffer_count);
      uVar4 = buffer_count->_M_elems[0x16];
      if (uVar4 == 0) {
        uVar4 = *local_50;
        __n = -lVar6;
        lVar6 = -sVar7;
        break;
      }
    }
    uVar5 = *local_50;
    local_38 = lVar6;
    if (uVar5 == 0) {
      fill<32U,_23U,_buffer_layout_dfs>::operator()(&local_62,local_58,buffer,buffer_count);
      uVar4 = buffer_count->_M_elems[0x16];
      uVar5 = buffer_count->_M_elems[0x17];
      if (uVar5 == 0) {
        __n = -local_38;
        lVar6 = -sVar7;
        goto LAB_00167377;
      }
    }
    __s1 = buffer[0x346 - uVar4];
    if (__s1 == (uchar *)0x0) {
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5c,"int cmp(const unsigned char *, const unsigned char *)");
    }
    __s2 = buffer[0x34e - uVar5];
    if (__s2 == (uchar *)0x0) {
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5d,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar2 = strcmp((char *)__s1,(char *)__s2);
    puVar3 = local_40;
    puVar1 = local_50;
    if (iVar2 < 1) {
      __s2 = __s1;
      puVar1 = local_40;
      uVar5 = uVar4;
    }
    *puVar1 = uVar5 - 1;
    buffer[sVar7 + 0x288] = __s2;
    check_input(local_60,sVar7);
    lVar6 = local_38 + -8;
    sVar7 = sVar7 + 1;
    if (sVar7 == 0xb6) {
      buffer_count->_M_elems[0xb] = 0xb6;
      return;
    }
  } while( true );
  do {
    if (uVar4 == 0) {
      fill<32U,_23U,_buffer_layout_dfs>::operator()(&local_63,local_58,buffer,buffer_count);
      uVar4 = buffer_count->_M_elems[0x17];
      if (uVar4 == 0) {
        __dest = local_48 + lVar6;
        from0 = (uchar **)((long)local_48 - __n);
        goto LAB_0016741d;
      }
    }
    *(uchar **)((long)buffer + __n + 0x1440) = buffer[0x34e - uVar4];
    uVar4 = uVar4 - 1;
    *local_50 = uVar4;
    lVar6 = lVar6 + -1;
    __n = __n + 8;
  } while (__n != 0x5b0);
  goto LAB_001673d4;
LAB_00167377:
  do {
    if (uVar4 == 0) {
      fill<32U,_22U,_buffer_layout_dfs>::operator()(&local_64,local_58,buffer,buffer_count);
      uVar4 = buffer_count->_M_elems[0x16];
      if (uVar4 == 0) {
        __dest = local_48 + lVar6;
        from0 = (uchar **)((long)local_48 - __n);
LAB_0016741d:
        sVar7 = -lVar6;
        memmove(__dest,local_60,__n);
        buffer_count->_M_elems[0xb] = sVar7;
        goto LAB_00167431;
      }
    }
    *(uchar **)((long)local_48 + (__n - 0x5b0)) = local_48[8 - uVar4];
    uVar4 = uVar4 - 1;
    *local_40 = uVar4;
    lVar6 = lVar6 + -1;
    __n = __n + 8;
  } while (__n != 0x5b0);
LAB_001673d4:
  buffer_count->_M_elems[0xb] = 0xb6;
  sVar7 = 0xb6;
  from0 = local_60;
LAB_00167431:
  check_input(from0,sVar7);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}